

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O0

void __thiscall DSDcc::DSDDstar::processData(DSDDstar *this)

{
  int iVar1;
  long in_RDI;
  DSDDstar *unaff_retaddr;
  int bit;
  long lVar2;
  undefined1 firstFrame;
  
  lVar2 = in_RDI;
  iVar1 = DSDSymbol::getDibit((DSDSymbol *)0x124671);
  firstFrame = (undefined1)((ulong)lVar2 >> 0x38);
  if (*(int *)(in_RDI + 0x10) == 0) {
    memset((void *)(in_RDI + 0x8cc),0,4);
    memset((void *)(in_RDI + 0x8c8),0,4);
    *(undefined4 *)(in_RDI + 0x8d0) = 0;
  }
  else if (*(int *)(in_RDI + 0x10) % 8 == 0) {
    *(int *)(in_RDI + 0x8d0) = *(int *)(in_RDI + 0x8d0) + 1;
  }
  *(char *)(in_RDI + 0x8cc + (ulong)*(uint *)(in_RDI + 0x8d0)) =
       *(char *)(in_RDI + 0x8cc + (ulong)*(uint *)(in_RDI + 0x8d0)) +
       (char)(iVar1 << ((byte)((long)*(int *)(in_RDI + 0x10) % 8) & 0x1f));
  if (*(int *)(in_RDI + 0x10) == 0x17) {
    if ((0 < *(int *)(in_RDI + 8)) && (*(int *)(in_RDI + 0x8cc) != *(int *)(in_RDI + 0x8c8))) {
      *(byte *)(in_RDI + 0x8cc) = *(byte *)(in_RDI + 0x8cc) ^ 0x70;
      *(byte *)(in_RDI + 0x8cd) = *(byte *)(in_RDI + 0x8cd) ^ 0x4f;
      *(byte *)(in_RDI + 0x8ce) = *(byte *)(in_RDI + 0x8ce) ^ 0x93;
      processSlowData(unaff_retaddr,(bool)firstFrame);
    }
    *(undefined4 *)(in_RDI + 0x10) = 0;
    *(undefined4 *)(in_RDI + 0xc) = 0;
  }
  else {
    *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + 1;
  }
  return;
}

Assistant:

void DSDDstar::processData()
{
    int bit = m_dsdDecoder->m_dsdSymbol.getDibit(); // get dibit from symbol

    if (m_symbolIndex == 0)
    {
        memset(slowdata, 0, 4);
        memset(nullBytes, 0, 4);
        slowdataIx = 0;
    }
    else if (m_symbolIndex%8 == 0)
    {
        slowdataIx++;
    }

    slowdata[slowdataIx] += bit<<(m_symbolIndex%8); // this is LSB first!

    if (m_symbolIndex == 24-1) // last bit in data frame
    {
//        std::cerr << "DSDDstar::processData: " << m_voiceFrameCount << std::endl;

        if ((m_voiceFrameCount > 0) && (memcmp(slowdata, nullBytes, 4) != 0))
        {
            slowdata[0] ^= 0x70;
            slowdata[1] ^= 0x4f;
            slowdata[2] ^= 0x93;
//            std::cerr << "DSDDstar::processData:"
//                    << " " << std::hex << (int) (slowdata[0])
//                    << " " << std::hex << (int) (slowdata[1])
//                    << " " << std::hex << (int) (slowdata[2])
//                    << " (" << m_voiceFrameCount << ")" << std::endl;
            processSlowData(m_voiceFrameCount == 1);
            //printf("unscrambled- %s",slowdata);
        }


        m_symbolIndex = 0;
        m_frameType = DStarVoiceFrame;
    }
    else
    {
        m_symbolIndex++;
    }
}